

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int lua_yieldk(lua_State *L,int nresults,lua_KContext ctx,lua_KFunction k)

{
  CallInfo *extraout_RAX;
  CallInfo *pCVar1;
  lua_KContext extraout_RDX;
  
  if (L->nCcalls < 0x10000) {
    pCVar1 = L->ci;
    L->status = '\x01';
    (pCVar1->u2).funcidx = nresults;
    if ((pCVar1->callstatus & 0x8000) == 0) {
      return 0;
    }
  }
  else {
    lua_yieldk_cold_1();
    pCVar1 = extraout_RAX;
    ctx = extraout_RDX;
  }
  (pCVar1->u).c.k = k;
  if (k != (lua_KFunction)0x0) {
    (pCVar1->u).c.ctx = ctx;
  }
  luaD_throw(L,'\x01');
}

Assistant:

LUA_API int lua_yieldk (lua_State *L, int nresults, lua_KContext ctx,
                        lua_KFunction k) {
  CallInfo *ci;
  luai_userstateyield(L, nresults);
  lua_lock(L);
  ci = L->ci;
  api_checkpop(L, nresults);
  if (l_unlikely(!yieldable(L))) {
    if (L != mainthread(G(L)))
      luaG_runerror(L, "attempt to yield across a C-call boundary");
    else
      luaG_runerror(L, "attempt to yield from outside a coroutine");
  }
  L->status = LUA_YIELD;
  ci->u2.nyield = nresults;  /* save number of results */
  if (isLua(ci)) {  /* inside a hook? */
    lua_assert(!isLuacode(ci));
    api_check(L, nresults == 0, "hooks cannot yield values");
    api_check(L, k == NULL, "hooks cannot continue after yielding");
  }
  else {
    if ((ci->u.c.k = k) != NULL)  /* is there a continuation? */
      ci->u.c.ctx = ctx;  /* save context */
    luaD_throw(L, LUA_YIELD);
  }
  lua_assert(ci->callstatus & CIST_HOOKED);  /* must be inside a hook */
  lua_unlock(L);
  return 0;  /* return to 'luaD_hook' */
}